

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O3

void __thiscall
burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
::increment(buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
            *this)

{
  istream_type *local_50;
  int local_48;
  undefined1 local_44;
  istream_type *local_40;
  int local_38;
  undefined1 local_34;
  buffer_value_type *local_30 [2];
  undefined5 local_20;
  undefined3 uStack_1b;
  undefined5 uStack_18;
  
  local_40 = (this->m_current)._M_stream;
  local_38 = (this->m_current)._M_value;
  local_34 = (this->m_current)._M_ok;
  local_50 = (this->m_end)._M_stream;
  local_48 = (this->m_end)._M_value;
  local_44 = (this->m_end)._M_ok;
  burst::detail::
  copy_at_most_n_impl<std::istream_iterator<int,char,std::char_traits<char>,long>,long,int*>
            (local_30,(detail *)&local_40,&local_50,this->m_chunk_size,
             (this->m_chunk).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  *(ulong *)((long)&(this->m_current)._M_stream + 5) = CONCAT53(uStack_18,uStack_1b);
  (this->m_current)._M_stream = (istream_type *)CONCAT35(uStack_1b,local_20);
  this->m_chunk_end = local_30[0];
  return;
}

Assistant:

void increment ()
        {
            std::tie(m_current, std::ignore, m_chunk_end) =
                copy_at_most_n(m_current, m_end, m_chunk_size, m_chunk.get());
        }